

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall avro::NodeEnum::NodeEnum(NodeEnum *this,HasName *name,LeafNames *symbols)

{
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  reference pvVar2;
  Exception *this_01;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  ulong __n;
  NoAttribute<int> local_109;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(&this->super_NodeImplEnum,AVRO_ENUM,name,
             (NoAttribute<boost::shared_ptr<avro::Node>_> *)&local_108,symbols,&local_109);
  (this->super_NodeImplEnum).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00190098;
  this_00 = &(this->super_NodeImplEnum).leafNameAttributes_;
  __n = 0;
  while( true ) {
    if ((ulong)((long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_NodeImplEnum).leafNameAttributes_.attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n) {
      return;
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this_00->attrs_,__n);
    bVar1 = concepts::
            NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::add(&(this->super_NodeImplEnum).nameIndex_,pvVar2,__n);
    if (!bVar1) break;
    __n = __n + 1;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_108,"Cannot add duplicate name: %1%");
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this_00->attrs_,__n);
  msg = boost::io::detail::
        feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string&>
                  (&local_108,pvVar2);
  Exception::Exception(this_01,msg);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

NodeEnum(const HasName &name, const LeafNames &symbols) :
        NodeImplEnum(AVRO_ENUM, name, NoLeaves(), symbols, NoSize())
    { 
        for(size_t i=0; i < leafNameAttributes_.size(); ++i) {
            if(!nameIndex_.add(leafNameAttributes_.get(i), i)) {
                 throw Exception(boost::format("Cannot add duplicate name: %1%") % leafNameAttributes_.get(i));
            }
        }
    }